

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

void VW_Set_Weight(VW_HANDLE handle,size_t index,size_t offset,float value)

{
  weight *pwVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)((long)handle + 0x35a8);
  if (*(char *)((long)handle + 0x3590) != '\0') {
    pbVar2 = (byte *)((long)handle + 0x35f0);
  }
  pwVar1 = parameters::operator[]
                     ((parameters *)((long)handle + 0x3590),(index & 0xffffffff) << (*pbVar2 & 0x3f)
                     );
  pwVar1[offset & 0xffffffff] = value;
  return;
}

Assistant:

VW_DLL_MEMBER void VW_CALLING_CONV VW_Set_Weight(VW_HANDLE handle, size_t index, size_t offset, float value)
{ vw* pointer = static_cast<vw*>(handle);
  return VW::set_weight(*pointer, (uint32_t) index, (uint32_t)offset, value);
}